

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

void __thiscall VehicleState::Propagator::State2OE(Propagator *this)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  Scalar *pSVar1;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  RealScalar RVar2;
  __type _Var3;
  double dVar4;
  RealScalar RVar5;
  double dVar6;
  double dVar7;
  ReturnType RVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double T_p;
  double M;
  double E;
  double meanmot;
  double P;
  double theta_rad;
  double theta;
  double w;
  Vector3d rhat;
  Vector3d ehat;
  Vector3d nhat;
  double Ohm;
  Vector3d nodeline;
  Vector3d x;
  double inc;
  double e;
  Vector3d ecen;
  double a;
  Vector3d h;
  double nv;
  double nr;
  Vector3d vel;
  Vector3d pos;
  double mu;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffcf8;
  int __y;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd00;
  Scalar *in_stack_fffffffffffffd18;
  Scalar SVar12;
  Matrix<double,_3,_1,_0,_3,_1> *this_01;
  StorageBaseType *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd48;
  double local_298;
  double local_290;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd90;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd98;
  double local_1c8;
  
  dVar9 = *(double *)(in_RDI + 0x90);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcf8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcf8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)((ulong)dVar9 ^ 0x8000000000000000)
  ;
  _Var3 = std::pow<double,int>
                    ((double)in_stack_fffffffffffffd00,
                     (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  dVar4 = (double)this_00 / (_Var3 - (dVar9 * 2.0) / RVar2);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  Eigen::operator*((double *)in_stack_fffffffffffffd48,(StorageBaseType *)in_stack_fffffffffffffd40)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this_00,in_RDI);
  Eigen::operator*((double *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
              *)in_stack_fffffffffffffcf8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffd00,(Index)in_stack_fffffffffffffcf8);
  this_01 = (Matrix<double,_3,_1,_0,_3,_1> *)*pSVar1;
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  dVar6 = acos((double)this_01 / RVar5);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (this_01,(Scalar *)this_00,(Scalar *)in_RDI,in_stack_fffffffffffffd18);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffd00,(Index)in_stack_fffffffffffffcf8);
  if (*pSVar1 < 0.0) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffd00,(Index)in_stack_fffffffffffffcf8);
    dVar7 = *pSVar1;
    RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                      (in_stack_fffffffffffffcf8);
    dVar7 = acos(dVar7 / RVar5);
    local_1c8 = 360.0 - (dVar7 * 180.0) / 3.141592653589793;
  }
  else {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffd00,(Index)in_stack_fffffffffffffcf8);
    SVar12 = *pSVar1;
    RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                      (in_stack_fffffffffffffcf8);
    dVar7 = acos(SVar12 / RVar5);
    local_1c8 = (dVar7 * 180.0) / 3.141592653589793;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffd48,(double *)in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffd48,(double *)in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffcf8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffd48,(double *)in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffcf8);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffd00,(Index)in_stack_fffffffffffffcf8);
  if (*pSVar1 < 0.0) {
    RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    dVar7 = acos(RVar8);
    local_290 = 360.0 - (dVar7 * 180.0) / 3.141592653589793;
  }
  else {
    RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    dVar7 = acos(RVar8);
    local_290 = (dVar7 * 180.0) / 3.141592653589793;
  }
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  if (RVar8 < 0.0) {
    RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __y = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    dVar7 = acos(RVar8);
    local_298 = 360.0 - (dVar7 * 180.0) / 3.141592653589793;
  }
  else {
    RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                      (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __y = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    dVar7 = acos(RVar8);
    local_298 = (dVar7 * 180.0) / 3.141592653589793;
  }
  _Var3 = std::pow<double,int>((double)in_stack_fffffffffffffd00,__y);
  dVar7 = sqrt(_Var3 / dVar9);
  dVar9 = sqrt((dVar4 * dVar4 * dVar4) / dVar9);
  dVar10 = tan(((local_298 * 3.141592653589793) / 180.0) / 2.0);
  dVar11 = sqrt((1.0 - RVar2) / (RVar2 + 1.0));
  dVar10 = atan(dVar10 * dVar11);
  dVar10 = dVar10 * 2.0;
  if (dVar10 < 0.0) {
    dVar10 = dVar10 + 6.283185307179586;
  }
  RVar5 = RVar2;
  dVar11 = sin(dVar10);
  *(double *)(in_RDI + 0x50) = dVar4;
  *(RealScalar *)(in_RDI + 0x58) = RVar2;
  *(double *)(in_RDI + 0x60) = (dVar6 * 180.0) / 3.141592653589793;
  *(double *)(in_RDI + 0x68) = local_1c8;
  *(double *)(in_RDI + 0x70) = local_290;
  *(double *)(in_RDI + 0x78) = local_298;
  *(double *)(in_RDI + 0x80) = dVar7 * 6.283185307179586;
  *(double *)(in_RDI + 0x88) =
       *(double *)(in_RDI + 0x108) - (-RVar5 * dVar11 + dVar10) / (1.0 / dVar9);
  return;
}

Assistant:

void Propagator::State2OE(){

		// extract locals
		double mu = this->mu_;
		Eigen::Vector3d pos = this->pos_;
		Eigen::Vector3d vel = this->vel_;

		//normalized pos and vel
		double nr = pos.norm();
		double nv = vel.norm();

		//find the angular momentum vector
		Eigen::Vector3d h = pos.cross(vel);

		//now we can calculate semi-major axis
		double a = -mu/(pow(nv,2) - 2*mu/nr);

		//ecentricity vector
		Eigen::Vector3d ecen = (1/mu)*(vel.cross(h) - (mu/nr)*pos);

		//ecentricity
		double e = ecen.norm();

		//inclination
		double inc = acos(h[2]/h.norm()) * 180.0 / M_PI;

		// now we need the line of nodes
		Eigen::Vector3d x(0.0, 0.0, 1.0);
		Eigen::Vector3d nodeline = x.cross(h);

		//calculate longitude of ascending node
		double Ohm;
		if (nodeline[1] >= 0) {
			Ohm = acos(nodeline[0]/nodeline.norm()) * 180.0 / M_PI;
		} else {
			Ohm = 360.0 - acos(nodeline[0]/nodeline.norm()) * 180.0 / M_PI;
		}

		// normalized eccentricity, line of nodes, and position
		Eigen::Vector3d nhat = nodeline/nodeline.norm();
		Eigen::Vector3d ehat = ecen/ecen.norm();
		Eigen::Vector3d rhat = pos/pos.norm();

		// calculate argument of periapsis
		double w;
		if (ehat[2] >= 0) {
			w = acos(nhat.dot(ehat)) * 180.0 / M_PI; // Q1 or Q4
		} else {
			w = 360.0 - acos(nhat.dot(ehat)) * 180.0 / M_PI; // Q2 or Q3
		}

		//calculate true anomally
		double theta;
		if (vel.dot(pos) >= 0) {
			theta = acos(ehat.dot(rhat)) * 180.0 / M_PI; // Q1 or Q4
		} else {
			theta = 360.0 - acos(ehat.dot(rhat)) * 180.0 / M_PI; // Q2 or Q3
		}

		// convert theta to radians
		double theta_rad = theta*M_PI/180.0;

		//calculate orbital period
		double P = 2*M_PI*sqrt(pow(a,3)/mu);

		// //eccentric anomaly (radians)
		// double E = acos((e + cos(theta_rad))/(1 + e*cos(theta_rad)));

		// //mean anomally (radians)
		// double M = E - e*sin(E);

		// // time of periapsis passage
		// double T_p = this->t_ - M*P/(2*M_PI);

		//find mean motion
		double meanmot = 1.0/sqrt(a*a*a/mu);

		//eccentric annomaly
		double E = 2.0*atan( tan(theta_rad/2.0) * sqrt( (1.0 - e)/(1.0 + e)));

		//guard domain
		if(E < 0.0) {
			E = E + 2.0*M_PI;
		}

		//mean anomally (radians)
		double M = E - e*sin(E);

		// time of periapsis passage
		double T_p = this->t_ - M/meanmot;

		// output our results
		// std::cout << "semi-major axis [km]: " << a << std::endl;
		// std::cout << "eccentricity: " << e << std::endl;
		// std::cout << "inclination [deg]: " << inc << std::endl;
		// std::cout << "longitude of ascending node [deg]: " << Ohm << std::endl;
		// std::cout << "argument of periapsis [deg]: " << w << std::endl;
		// std::cout << "true anomally [deg]: " << theta << std::endl;
		// std::cout << "time of periapsis passage: " T_p << std::endl;

		//assign results to class
		this->a_ = a; //semi-major axis
		this->e_ = e; //eccentricity
		this->i_ = inc; //inclination
		this->ascend_ = Ohm; //longitude of ascending node
		this->periap_ = w; //argument of periapsis
		this->nu_ = theta; //true anomaly
		this->P_ = P; //orbital period 
		this->T_p_ = T_p; //time from periapse

	}